

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void initialize_impute_calc<ImputedData<unsigned_long,long_double>,InputData<float,unsigned_long>>
               (ImputedData<unsigned_long,_long_double> *imp,
               InputData<float,_unsigned_long> *input_data,size_t row)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  float *pfVar2;
  pointer puVar3;
  size_t sVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  int *piVar9;
  ulong *puVar10;
  ulong uVar11;
  size_type __n;
  unsigned_long uVar12;
  vector<long_double,_std::allocator<long_double>_> *this;
  ulong uVar13;
  ulong uVar14;
  value_type_conflict3 local_38;
  
  imp->n_missing_num = 0;
  imp->n_missing_cat = 0;
  imp->n_missing_sp = 0;
  if (input_data->numeric_data == (float *)0x0) {
    if (input_data->Xc_indptr == (unsigned_long *)0x0) goto LAB_002f99fd;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&imp->missing_sp,input_data->ncols_numeric);
    if (input_data->ncols_numeric != 0) {
      pfVar2 = input_data->Xc;
      puVar5 = input_data->Xc_ind;
      puVar6 = input_data->Xc_indptr;
      puVar3 = (imp->missing_sp).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar12 = 0;
      do {
        uVar7 = puVar6[uVar12];
        uVar8 = puVar6[uVar12 + 1];
        puVar10 = puVar5 + uVar7;
        uVar11 = (long)(uVar8 * 8 + uVar7 * -8) >> 3;
        while (0 < (long)uVar11) {
          uVar13 = uVar11 >> 1;
          uVar14 = ~uVar13 + uVar11;
          uVar11 = uVar13;
          if (puVar10[uVar13] < row) {
            puVar10 = puVar10 + uVar13 + 1;
            uVar11 = uVar14;
          }
        }
        if (((puVar10 != puVar5 + uVar8) && (*puVar10 == row)) &&
           (0x7f7fffff <
            (*(uint *)((long)pfVar2 + ((long)puVar10 - (long)puVar5 >> 1)) & 0x7fffffff))) {
          sVar4 = imp->n_missing_sp;
          imp->n_missing_sp = sVar4 + 1;
          puVar3[sVar4] = uVar12;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < input_data->ncols_numeric);
    }
    local_38._0_10_ = (longdouble)0;
    std::vector<long_double,_std::allocator<long_double>_>::_M_fill_assign
              (&imp->sp_num_sum,imp->n_missing_sp,&local_38);
    this = &imp->sp_num_weight;
    __n = imp->n_missing_sp;
  }
  else {
    pvVar1 = &imp->missing_num;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (pvVar1,input_data->ncols_numeric);
    if (input_data->ncols_numeric != 0) {
      pfVar2 = input_data->numeric_data;
      puVar3 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = 0;
      do {
        if (0x7f7fffff < (uint)ABS(pfVar2[row + input_data->nrows * uVar11])) {
          sVar4 = imp->n_missing_num;
          imp->n_missing_num = sVar4 + 1;
          puVar3[sVar4] = uVar11;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < input_data->ncols_numeric);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(pvVar1,imp->n_missing_num);
    local_38._0_10_ = (longdouble)0;
    std::vector<long_double,_std::allocator<long_double>_>::_M_fill_assign
              (&imp->num_sum,imp->n_missing_num,&local_38);
    this = &imp->num_weight;
    __n = imp->n_missing_num;
  }
  local_38._0_10_ = (longdouble)0;
  std::vector<long_double,_std::allocator<long_double>_>::_M_fill_assign(this,__n,&local_38);
LAB_002f99fd:
  if (input_data->categ_data != (int *)0x0) {
    pvVar1 = &imp->missing_cat;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (pvVar1,input_data->ncols_categ);
    if (input_data->ncols_categ != 0) {
      piVar9 = input_data->categ_data;
      puVar3 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = 0;
      do {
        if (piVar9[row + input_data->nrows * uVar11] < 0) {
          sVar4 = imp->n_missing_cat;
          imp->n_missing_cat = sVar4 + 1;
          puVar3[sVar4] = uVar11;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < input_data->ncols_categ);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(pvVar1,imp->n_missing_cat);
    local_38._0_10_ = (longdouble)0;
    std::vector<long_double,_std::allocator<long_double>_>::_M_fill_assign
              (&imp->cat_weight,imp->n_missing_cat,&local_38);
    std::
    vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ::resize(&imp->cat_sum,input_data->ncols_categ);
    if (imp->n_missing_cat != 0) {
      uVar11 = 0;
      do {
        uVar12 = (imp->missing_cat).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11];
        local_38._0_10_ = (longdouble)0;
        std::vector<long_double,_std::allocator<long_double>_>::_M_fill_assign
                  ((imp->cat_sum).
                   super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar12,(long)input_data->ncat[uVar12]
                   ,&local_38);
        uVar11 = uVar11 + 1;
      } while (uVar11 < imp->n_missing_cat);
    }
  }
  return;
}

Assistant:

void initialize_impute_calc(ImputedData &imp, InputData &input_data, size_t row)
{
    imp.n_missing_num = 0;
    imp.n_missing_cat = 0;
    imp.n_missing_sp  = 0;

    if (input_data.numeric_data != NULL)
    {
        imp.missing_num.resize(input_data.ncols_numeric);
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            if (is_na_or_inf(input_data.numeric_data[row + col * input_data.nrows]))
                imp.missing_num[imp.n_missing_num++] = col;
        imp.missing_num.resize(imp.n_missing_num);
        imp.num_sum.assign(imp.n_missing_num,    0);
        imp.num_weight.assign(imp.n_missing_num, 0);
    }

    else if (input_data.Xc_indptr != NULL)
    {
        imp.missing_sp.resize(input_data.ncols_numeric);
        decltype(input_data.Xc_indptr) res;
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            res = std::lower_bound(input_data.Xc_ind + input_data.Xc_indptr[col],
                                   input_data.Xc_ind + input_data.Xc_indptr[col + 1],
                                   row);
            if (
                res != input_data.Xc_ind + input_data.Xc_indptr[col + 1] && 
                *res == static_cast<typename std::remove_pointer<decltype(res)>::type>(row) && 
                is_na_or_inf(input_data.Xc[res - input_data.Xc_ind])
                )
            {
                imp.missing_sp[imp.n_missing_sp++] = col;
            }
        }
        imp.sp_num_sum.assign(imp.n_missing_sp,    0);
        imp.sp_num_weight.assign(imp.n_missing_sp, 0);
    }
    
    if (input_data.categ_data != NULL)
    {
        imp.missing_cat.resize(input_data.ncols_categ);
        for (size_t col = 0; col < input_data.ncols_categ; col++)
            if (input_data.categ_data[row + col * input_data.nrows] < 0)
                imp.missing_cat[imp.n_missing_cat++] = col;
        imp.missing_cat.resize(imp.n_missing_cat);
        imp.cat_weight.assign(imp.n_missing_cat, 0);
        imp.cat_sum.resize(input_data.ncols_categ);
        for (size_t cat = 0; cat < imp.n_missing_cat; cat++)
            imp.cat_sum[imp.missing_cat[cat]].assign(input_data.ncat[imp.missing_cat[cat]], 0);
    }
}